

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

cl_int __thiscall
CLIntercept::autoPartitionGetDeviceIDs
          (CLIntercept *this,cl_platform_id platform,cl_device_type device_type,cl_uint num_entries,
          cl_device_id *devices,cl_uint *num_devices)

{
  cl_int cVar1;
  pthread_mutex_t *__mutex;
  pointer pp_Var2;
  int iVar3;
  mapped_type *this_00;
  _cl_device_id *p_Var4;
  ulong uVar5;
  undefined8 uVar6;
  pointer __args;
  ulong uVar7;
  pointer pp_Var8;
  float extraout_XMM0_Da;
  float __x;
  float extraout_XMM0_Da_00;
  float __x_00;
  float __x_01;
  float extraout_XMM0_Da_01;
  cl_uint numSubDevices;
  _cl_device_id *parent;
  cl_uint numDevices;
  cl_device_partition_property props [3];
  string deviceInfo;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> parentDevices;
  cl_uint local_e4;
  _cl_device_id *local_e0;
  _cl_device_id **local_d8;
  iterator iStack_d0;
  _cl_device_id **local_c8;
  cl_int local_b4;
  cl_uint local_b0;
  cl_uint local_ac;
  cl_device_partition_property local_a8;
  ulong uStack_a0;
  undefined8 local_98;
  cl_uint *local_88;
  pthread_mutex_t *local_80;
  string local_78;
  vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_> local_58;
  cl_device_id *local_38;
  
  local_88 = num_devices;
  local_38 = devices;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar3 != 0) {
    uVar6 = std::__throw_system_error(iVar3);
    if (local_d8 != (_cl_device_id **)0x0) {
      operator_delete(local_d8);
    }
    if (local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    pthread_mutex_unlock(local_80);
    _Unwind_Resume(uVar6);
  }
  local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_start = (cl_device_id *)0x0;
  local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (cl_device_id *)0x0;
  local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = (_cl_device_id **)0x0;
  local_d8 = (_cl_device_id **)0x0;
  iStack_d0._M_current = (_cl_device_id **)0x0;
  local_b0 = 0;
  local_80 = (pthread_mutex_t *)&this->m_Mutex;
  local_b4 = (*(this->m_Dispatch).clGetDeviceIDs)
                       (platform,device_type,0,(cl_device_id *)0x0,&local_b0);
  local_ac = num_entries;
  if (local_b0 != 0 && local_b4 == 0) {
    std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
              (&local_58,(ulong)local_b0);
    local_b4 = (*(this->m_Dispatch).clGetDeviceIDs)
                         (platform,device_type,local_b0,
                          local_58.
                          super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
  }
  pp_Var2 = local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pp_Var8 = local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      local_e0 = *pp_Var8;
      this_00 = std::
                map<_cl_device_id_*,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>_>_>_>
                ::operator[](&this->m_SubDeviceCacheMap,&local_e0);
      if ((this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl.
          super__Vector_impl_data._M_start ==
          (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        getDeviceInfoString(this,1,&local_e0,&local_78);
        __x_00 = extraout_XMM0_Da;
        if (((this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
             _M_impl.super__Vector_impl_data._M_finish ==
             (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
             _M_impl.super__Vector_impl_data._M_start) &&
           ((this->m_Config).AutoPartitionByAffinityDomain == true)) {
          local_a8 = 0x1088;
          uStack_a0 = 0x20;
          local_98 = 0;
          local_e4 = 0;
          (*(this->m_Dispatch).clCreateSubDevices)
                    (local_e0,&local_a8,0,(cl_device_id *)0x0,&local_e4);
          __x_00 = __x;
          if (1 < local_e4) {
            logf(this,__x);
            std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
                      (this_00,(ulong)local_e4);
            (*(this->m_Dispatch).clCreateSubDevices)
                      (local_e0,&local_a8,local_e4,
                       (this_00->
                       super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                       _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
            __x_00 = extraout_XMM0_Da_00;
          }
        }
        if (((this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
             _M_impl.super__Vector_impl_data._M_finish ==
             (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
             _M_impl.super__Vector_impl_data._M_start) &&
           (uVar5 = (ulong)(this->m_Config).AutoPartitionEqually, uVar5 != 0)) {
          local_a8 = 0x1086;
          local_98 = 0;
          local_e4 = 0;
          uStack_a0 = uVar5;
          (*(this->m_Dispatch).clCreateSubDevices)
                    (local_e0,&local_a8,0,(cl_device_id *)0x0,&local_e4);
          __x_00 = __x_01;
          if (1 < local_e4) {
            logf(this,__x_01);
            std::vector<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>::resize
                      (this_00,(ulong)local_e4);
            (*(this->m_Dispatch).clCreateSubDevices)
                      (local_e0,&local_a8,local_e4,
                       (this_00->
                       super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                       _M_impl.super__Vector_impl_data._M_start,(cl_uint *)0x0);
            __x_00 = extraout_XMM0_Da_01;
          }
        }
        if ((this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl
            .super__Vector_impl_data._M_finish ==
            (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl
            .super__Vector_impl_data._M_start) {
          logf(this,__x_00);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      if ((this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl.
          super__Vector_impl_data._M_finish ==
          (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>)._M_impl.
          super__Vector_impl_data._M_start) {
LAB_0016fee9:
        p_Var4 = local_e0;
        __args = &local_e0;
        if (iStack_d0._M_current == local_c8) {
LAB_0016ff08:
          std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>::
          _M_realloc_insert<_cl_device_id*const&>
                    ((vector<_cl_device_id*,std::allocator<_cl_device_id*>> *)&local_d8,iStack_d0,
                     __args);
        }
        else {
LAB_0016fefa:
          *iStack_d0._M_current = p_Var4;
          iStack_d0._M_current = iStack_d0._M_current + 1;
        }
      }
      else {
        if ((this->m_Config).AutoPartitionAllDevices == true) {
          if (iStack_d0._M_current == local_c8) {
            std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>::
            _M_realloc_insert<_cl_device_id*const&>
                      ((vector<_cl_device_id*,std::allocator<_cl_device_id*>> *)&local_d8,iStack_d0,
                       &local_e0);
          }
          else {
            *iStack_d0._M_current = local_e0;
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
        }
        if (((this->m_Config).AutoPartitionAllDevices == false) &&
           ((this->m_Config).AutoPartitionAllSubDevices != true)) {
          if ((this->m_Config).AutoPartitionSingleSubDevice != true) goto LAB_0016fee9;
          __args = (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (iStack_d0._M_current == local_c8) goto LAB_0016ff08;
          p_Var4 = *__args;
          goto LAB_0016fefa;
        }
        std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<_cl_device_id**,std::vector<_cl_device_id*,std::allocator<_cl_device_id*>>>>
                  ((vector<_cl_device_id*,std::allocator<_cl_device_id*>> *)&local_d8,
                   iStack_d0._M_current,
                   (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   (this_00->super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      pp_Var8 = pp_Var8 + 1;
    } while (pp_Var8 != pp_Var2);
  }
  __mutex = local_80;
  cVar1 = local_b4;
  if (local_b4 == 0) {
    uVar5 = (long)iStack_d0._M_current - (long)local_d8 >> 3;
    if (iStack_d0._M_current != local_d8) {
      uVar7 = 0;
      do {
        if ((uint)uVar7 < local_ac) {
          local_38[uVar7] = local_d8[uVar7];
        }
        uVar7 = uVar7 + 1;
      } while ((uVar7 & 0xffffffff) < uVar5);
    }
    if (local_88 != (cl_uint *)0x0) {
      *local_88 = (cl_uint)uVar5;
    }
  }
  if (local_d8 != (_cl_device_id **)0x0) {
    operator_delete(local_d8);
  }
  if (local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>._M_impl.
      super__Vector_impl_data._M_start != (cl_device_id *)0x0) {
    operator_delete(local_58.super__Vector_base<_cl_device_id_*,_std::allocator<_cl_device_id_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pthread_mutex_unlock(__mutex);
  return cVar1;
}

Assistant:

cl_int CLIntercept::autoPartitionGetDeviceIDs(
    cl_platform_id platform,
    cl_device_type device_type,
    cl_uint num_entries,
    cl_device_id* devices,
    cl_uint* num_devices )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().AutoPartitionAllDevices ||
                config().AutoPartitionAllSubDevices ||
                config().AutoPartitionSingleSubDevice );

    cl_int  errorCode = CL_SUCCESS;
    std::vector<cl_device_id>   parentDevices;
    std::vector<cl_device_id>   returnedDevices;

    cl_uint numDevices = 0;
    errorCode = dispatch().clGetDeviceIDs(
        platform,
        device_type,
        0,
        NULL,
        &numDevices );
    if( errorCode == CL_SUCCESS && numDevices != 0 )
    {
        parentDevices.resize(numDevices);
        errorCode = dispatch().clGetDeviceIDs(
            platform,
            device_type,
            numDevices,
            parentDevices.data(),
            NULL );
    }

    for( auto parent : parentDevices )
    {
        std::vector<cl_device_id>&  subDevices = m_SubDeviceCacheMap[parent];

        if( subDevices.empty() )
        {
            std::string deviceInfo;
            getDeviceInfoString(
                1,
                &parent,
                deviceInfo );

            if( subDevices.size() == 0 &&
                config().AutoPartitionByAffinityDomain )
            {
                const cl_device_partition_property props[] = {
                    CL_DEVICE_PARTITION_BY_AFFINITY_DOMAIN,
                    CL_DEVICE_AFFINITY_DOMAIN_NEXT_PARTITIONABLE,
                    0
                };

                cl_uint numSubDevices = 0;
                dispatch().clCreateSubDevices(
                    parent,
                    props,
                    0,
                    NULL,
                    &numSubDevices );
                if( numSubDevices > 1 )
                {
                    logf("Partitioned device %s by affinity domain into %u sub-devices.\n",
                        deviceInfo.c_str(),
                        numSubDevices );

                    subDevices.resize(numSubDevices);
                    dispatch().clCreateSubDevices(
                        parent,
                        props,
                        numSubDevices,
                        subDevices.data(),
                        NULL );
                }
            }

            if( subDevices.size() == 0 &&
                config().AutoPartitionEqually )
            {
                const cl_device_partition_property props[] = {
                    CL_DEVICE_PARTITION_EQUALLY,
                    (cl_device_partition_property)config().AutoPartitionEqually,
                    0
                };

                cl_uint numSubDevices = 0;
                dispatch().clCreateSubDevices(
                    parent,
                    props,
                    0,
                    NULL,
                    &numSubDevices );
                if( numSubDevices > 1 )
                {
                    logf("Partitioned device %s equally into %u sub-devices with %u compute unit%s.\n",
                        deviceInfo.c_str(),
                        numSubDevices,
                        config().AutoPartitionEqually,
                        config().AutoPartitionEqually > 1 ? "s" : "" );

                    subDevices.resize(numSubDevices);
                    dispatch().clCreateSubDevices(
                        parent,
                        props,
                        numSubDevices,
                        subDevices.data(),
                        NULL );
                }
            }

            if( subDevices.size() == 0 )
            {
                logf("Couldn't partition device %s.\n",
                    deviceInfo.c_str() );
            }
        }

        if( subDevices.size() == 0 )
        {
            returnedDevices.push_back(parent);
        }
        else
        {
            if( config().AutoPartitionAllDevices )
            {
                returnedDevices.push_back(parent);
            }
            if( config().AutoPartitionAllDevices ||
                config().AutoPartitionAllSubDevices )
            {
                returnedDevices.insert(
                    returnedDevices.end(),
                    subDevices.begin(),
                    subDevices.end() );
            }
            else if( config().AutoPartitionSingleSubDevice )
            {
                returnedDevices.push_back( subDevices.front() );
            }
            else
            {
                CLI_ASSERT( 0 );
                returnedDevices.push_back( parent );
            }
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        for( cl_uint d = 0; d < returnedDevices.size(); d++ )
        {
            if( d < num_entries )
            {
                devices[d] = returnedDevices[d];
            }
        }

        if( num_devices )
        {
            num_devices[0] = (cl_uint)returnedDevices.size();
        }
    }

    return errorCode;
}